

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamToolsIndex::CheckVersion(BamToolsIndex *this)

{
  IBamIODevice *pIVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  BamException *pBVar4;
  string message;
  string local_68;
  string local_48;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,&this->m_inputVersion,4);
  if (CONCAT44(extraout_var,iVar2) != 4) {
    pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"BamToolsIndex::CheckVersion","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"could not read format version","");
    BamException::BamException(pBVar4,&local_68,&local_48);
    __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
  }
  uVar3 = this->m_inputVersion;
  if (this->m_isBigEndian == true) {
    uVar3 = uVar3 << 0x18 | (int)uVar3 >> 0x18 | (uVar3 & 0xff00) << 8 | uVar3 >> 8 & 0xff00;
    this->m_inputVersion = uVar3;
  }
  if ((int)uVar3 < 1) {
    pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"BamToolsIndex::CheckVersion","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"invalid format version","")
    ;
    BamException::BamException(pBVar4,&local_68,&local_48);
    __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
  }
  if ((int)this->m_outputVersion < (int)uVar3) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "unsupported format: this index was created by a newer version of BamTools. Update your local version of BamTools to use the index file."
               ,"");
    pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"BamToolsIndex::CheckVersion","");
    BamException::BamException(pBVar4,&local_48,&local_68);
    __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
  }
  if (3 < uVar3) {
    return;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "unsupported format: this version of the index may not properly handle coordinate intervals. Please run \'bamtools index -bti -in yourData.bam\' to generate an up-to-date, fixed BTI file."
             ,"");
  pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"BamToolsIndex::CheckVersion","");
  BamException::BamException(pBVar4,&local_48,&local_68);
  __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::CheckVersion()
{

    // read version from file
    const int64_t numBytesRead =
        m_resources.Device->Read((char*)&m_inputVersion, sizeof(m_inputVersion));
    if (numBytesRead != sizeof(m_inputVersion))
        throw BamException("BamToolsIndex::CheckVersion", "could not read format version");
    if (m_isBigEndian) SwapEndian_32(m_inputVersion);

    // if version is negative, or zero
    if (m_inputVersion <= 0)
        throw BamException("BamToolsIndex::CheckVersion", "invalid format version");

    // if version is newer than can be supported by this version of bamtools
    else if (m_inputVersion > m_outputVersion) {
        const std::string message =
            "unsupported format: this index was created by a newer version of BamTools. "
            "Update your local version of BamTools to use the index file.";
        throw BamException("BamToolsIndex::CheckVersion", message);
    }

    // ------------------------------------------------------------------
    // check for deprecated, unsupported versions
    // (the format had to be modified to accomodate a particular bug fix)

    // Version 2.0: introduced support for half-open intervals, instead of the old closed intervals
    //   respondBy: throwing exception - we're not going to try to handle the old BTI files.
    else if ((Version)m_inputVersion < BamToolsIndex::BTI_2_0) {
        const std::string message =
            "unsupported format: this version of the index may not properly handle "
            "coordinate intervals. Please run 'bamtools index -bti -in yourData.bam' "
            "to generate an up-to-date, fixed BTI file.";
        throw BamException("BamToolsIndex::CheckVersion", message);
    }
}